

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window)

{
  long in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float snap_y_max;
  float snap_y_min;
  float scroll_target_y;
  float center_y_ratio;
  float decoration_total_height;
  float snap_x_max;
  float snap_x_min;
  float scroll_target_x;
  float center_x_ratio;
  float decoration_total_width;
  ImVec2 scroll;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  float in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 local_1c;
  undefined8 local_8;
  
  local_8 = *(ImVec2 *)(in_RDI + 0x5c);
  if (*(float *)(in_RDI + 0x6c) <= 3.4028235e+38 && *(float *)(in_RDI + 0x6c) != 3.4028235e+38) {
    fVar4 = *(float *)(in_RDI + 0x84);
    fVar5 = *(float *)(in_RDI + 0x74);
    local_1c = *(float *)(in_RDI + 0x6c);
    if (0.0 < *(float *)(in_RDI + 0x7c)) {
      local_1c = CalcScrollEdgeSnap(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                                    in_stack_ffffffffffffffb8,0.0,1.698625e-39);
    }
    local_8._4_4_ = (float)((ulong)local_8 >> 0x20);
    local_8 = (ImVec2)CONCAT44(local_8._4_4_,-fVar5 * (*(float *)(in_RDI + 0x20) - fVar4) + local_1c
                              );
  }
  if (*(float *)(in_RDI + 0x70) <= 3.4028235e+38 && *(float *)(in_RDI + 0x70) != 3.4028235e+38) {
    fVar1 = ImGuiWindow::TitleBarHeight
                      ((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
    ;
    fVar2 = ImGuiWindow::MenuBarHeight
                      ((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0))
    ;
    fVar4 = *(float *)(in_RDI + 0x88);
    fVar5 = *(float *)(in_RDI + 0x78);
    fVar3 = *(float *)(in_RDI + 0x70);
    if (0.0 < *(float *)(in_RDI + 0x80)) {
      fVar3 = CalcScrollEdgeSnap(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                                 in_stack_ffffffffffffffb8,0.0,1.699014e-39);
    }
    local_8 = (ImVec2)CONCAT44(-fVar5 * (*(float *)(in_RDI + 0x24) - (fVar1 + fVar2 + fVar4)) +
                               fVar3,(float)local_8);
  }
  fVar4 = ImMax<float>((float)local_8,0.0);
  fVar5 = ImMax<float>(local_8._4_4_,0.0);
  local_8._4_4_ = (float)(int)fVar5;
  local_8._0_4_ = (float)(int)fVar4;
  if (((*(byte *)(in_RDI + 0x91) & 1) == 0) && ((*(byte *)(in_RDI + 0x93) & 1) == 0)) {
    local_8._0_4_ = ImMin<float>((float)(int)fVar4,*(float *)(in_RDI + 100));
    local_8._4_4_ = ImMin<float>((float)(int)fVar5,*(float *)(in_RDI + 0x68));
  }
  return local_8;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window)
{
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float decoration_total_width = window->ScrollbarSizes.x;
        float center_x_ratio = window->ScrollTargetCenterRatio.x;
        float scroll_target_x = window->ScrollTarget.x;
        if (window->ScrollTargetEdgeSnapDist.x > 0.0f)
        {
            float snap_x_min = 0.0f;
            float snap_x_max = window->ScrollMax.x + window->SizeFull.x - decoration_total_width;
            scroll_target_x = CalcScrollEdgeSnap(scroll_target_x, snap_x_min, snap_x_max, window->ScrollTargetEdgeSnapDist.x, center_x_ratio);
        }
        scroll.x = scroll_target_x - center_x_ratio * (window->SizeFull.x - decoration_total_width);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        float decoration_total_height = window->TitleBarHeight() + window->MenuBarHeight() + window->ScrollbarSizes.y;
        float center_y_ratio = window->ScrollTargetCenterRatio.y;
        float scroll_target_y = window->ScrollTarget.y;
        if (window->ScrollTargetEdgeSnapDist.y > 0.0f)
        {
            float snap_y_min = 0.0f;
            float snap_y_max = window->ScrollMax.y + window->SizeFull.y - decoration_total_height;
            scroll_target_y = CalcScrollEdgeSnap(scroll_target_y, snap_y_min, snap_y_max, window->ScrollTargetEdgeSnapDist.y, center_y_ratio);
        }
        scroll.y = scroll_target_y - center_y_ratio * (window->SizeFull.y - decoration_total_height);
    }
    scroll.x = IM_FLOOR(ImMax(scroll.x, 0.0f));
    scroll.y = IM_FLOOR(ImMax(scroll.y, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}